

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O3

Bond_p __thiscall indigox::Molecule::GetBondIndex(Molecule *this,uid_t i)

{
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 *puVar2;
  element_type *this_02;
  _Atomic_word _Var3;
  int iVar4;
  iterator iVar5;
  uid_t uVar6;
  uid_t uVar7;
  element_type *peVar8;
  uid_t in_RDX;
  Bond *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined8 *puVar10;
  bool bVar11;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false,_false>,_bool>
  pVar12;
  Bond_p BVar13;
  Bond_p b;
  CountableObject<indigox::Molecule> local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  uid_t local_40;
  uid_t local_38;
  
  (this->super_CountableObject<indigox::Molecule>).id_ = 0;
  (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
  super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  this_00 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)(i + 0xa8);
  local_40 = in_RDX;
  iVar5 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(this_00,&local_40);
  if (((iVar5.
        super__Node_iterator_base<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false>
        ._M_cur != (__node_type *)0x0) &&
      (this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)iVar5.
                         super__Node_iterator_base<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false>
                         ._M_cur + 0x18),
      this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) &&
     (this_01->_M_use_count != 0)) {
    _Var3 = this_01->_M_use_count;
    do {
      LOCK();
      iVar4 = this_01->_M_use_count;
      bVar11 = _Var3 == iVar4;
      if (bVar11) {
        this_01->_M_use_count = _Var3 + 1;
        iVar4 = _Var3;
      }
      _Var3 = iVar4;
      UNLOCK();
    } while (!bVar11);
    uVar6 = Bond::GetIndex(*(Bond **)((long)iVar5.
                                            super__Node_iterator_base<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false>
                                            ._M_cur + 0x10));
    uVar7 = local_40;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    if (uVar6 == uVar7) {
      peVar8 = *(element_type **)
                ((long)iVar5.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false>
                       ._M_cur + 0x18);
      if (peVar8 == (element_type *)0x0) {
        peVar8 = (element_type *)0x0;
LAB_0010a8e9:
        _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        iVar4 = *(int *)&(peVar8->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                         super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        do {
          if (iVar4 == 0) {
            peVar8 = (element_type *)0x0;
            goto LAB_0010a8ef;
          }
          LOCK();
          iVar1 = *(int *)&(peVar8->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                           super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          bVar11 = iVar4 == iVar1;
          if (bVar11) {
            *(int *)&(peVar8->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                     super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 iVar4 + 1;
            iVar1 = iVar4;
          }
          iVar4 = iVar1;
          UNLOCK();
        } while (!bVar11);
        if (*(int *)&(peVar8->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                     super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr == 0)
        goto LAB_0010a8e9;
        _Var9._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       ((long)iVar5.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false>
                              ._M_cur + 0x10);
      }
LAB_0010a8ef:
      (this->super_CountableObject<indigox::Molecule>).id_ = (uid_t)_Var9._M_pi;
      this_02 = (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
      super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar8;
      if (this_02 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
        _Var9._M_pi = extraout_RDX_01;
      }
      goto LAB_0010a8d4;
    }
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(this_00);
  puVar10 = *(undefined8 **)(i + 0x58);
  puVar2 = *(undefined8 **)(i + 0x60);
  _Var9._M_pi = extraout_RDX;
  if (puVar10 != puVar2) {
    do {
      local_50.id_ = *puVar10;
      local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar10[1];
      if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
        }
      }
      uVar7 = Bond::GetIndex(local_50.id_);
      if (uVar7 == local_40) {
        (this->super_CountableObject<indigox::Molecule>).id_ = local_50.id_;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<indigox::Molecule>,&local_48);
      }
      local_38 = Bond::GetIndex(local_50.id_);
      pVar12 = std::
               _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               ::_M_emplace<unsigned_long,std::shared_ptr<indigox::Bond>&>
                         ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                           *)this_00,&local_38,&local_50);
      _Var9._M_pi = pVar12._8_8_;
      if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
        _Var9._M_pi = extraout_RDX_00;
      }
      puVar10 = puVar10 + 2;
    } while (puVar10 != puVar2);
  }
LAB_0010a8d4:
  BVar13.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  BVar13.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Bond_p)BVar13.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Bond_p Molecule::GetBondIndex(uid_t i) {
  Bond_p bnd = Bond_p();
  auto it = idx_to_bond_.find(i);
  if (it != idx_to_bond_.end() && !(it->second.expired())
      && it->second.lock()->GetIndex() == i) {
    bnd = it->second.lock();
  } else {
    idx_to_bond_.clear();
    for (Bond_p b : bonds_) {
      if (b->GetIndex() == i) bnd = b;
      idx_to_bond_.emplace(b->GetIndex(), b);
    }
  }
  return bnd;
}